

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

int linenoise::unicodeUTF8CharLen(char *buf,int buf_len,int pos)

{
  byte bVar1;
  int iVar2;
  
  if (pos == buf_len) {
    return 0;
  }
  bVar1 = buf[pos];
  if ((char)bVar1 < '\0') {
    if (0xdf < bVar1) {
      return 4 - (uint)(bVar1 < 0xf0);
    }
    iVar2 = 2;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

inline int unicodeUTF8CharLen(char* buf, int buf_len, int pos)
{
    if (pos == buf_len) { return 0; }
    unsigned char ch = buf[pos];
    if (ch < 0x80) { return 1; }
    else if (ch < 0xE0) { return 2; }
    else if (ch < 0xF0) { return 3; }
    else { return 4; }
}